

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::setPrimalBounds(SPxSolverBase<double> *this)

{
  VectorBase<double> *this_00;
  VectorBase<double> *this_01;
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  
  std::vector<double,_std::allocator<double>_>::reserve
            (&(this->theUCbound).val,
             (long)(int)((ulong)((long)*(pointer *)
                                        ((long)&(this->super_SPxLPBase<double>).
                                                super_LPColSetBase<double>.up.val.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.
                                      val.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->theUCbound).val,
             &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val);
  std::vector<double,_std::allocator<double>_>::reserve
            (&(this->theLCbound).val,
             (long)(int)((ulong)((long)*(pointer *)
                                        ((long)&(this->super_SPxLPBase<double>).
                                                super_LPColSetBase<double>.low.val.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.low
                                      .val.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->theLCbound).val,
             &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val);
  this_00 = &this->theURbound;
  this_01 = &this->theLRbound;
  if (this->theRep != ROW) {
    std::vector<double,_std::allocator<double>_>::reserve
              (&this_00->val,
               (long)(int)((ulong)((long)*(pointer *)
                                          ((long)&(this->super_SPxLPBase<double>).
                                                  super_LPRowSetBase<double>.left.val.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                        left.val.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
    std::vector<double,_std::allocator<double>_>::operator=
              (&this_00->val,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val);
    std::vector<double,_std::allocator<double>_>::reserve
              (&this_01->val,
               (long)(int)((ulong)((long)*(pointer *)
                                          ((long)&(this->super_SPxLPBase<double>).
                                                  super_LPRowSetBase<double>.right.val.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                        right.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
    std::vector<double,_std::allocator<double>_>::operator=
              (&this_01->val,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val);
    pdVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (uint)((ulong)((long)(this->theURbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] = -pdVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
    pdVar1 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (uint)((ulong)((long)(this->theLRbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] = -pdVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
    return;
  }
  std::vector<double,_std::allocator<double>_>::reserve
            (&this_00->val,
             (long)(int)((ulong)((long)*(pointer *)
                                        ((long)&(this->super_SPxLPBase<double>).
                                                super_LPRowSetBase<double>.right.val.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                      right.val.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::vector<double,_std::allocator<double>_>::operator=
            (&this_00->val,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val);
  std::vector<double,_std::allocator<double>_>::reserve
            (&this_01->val,
             (long)(int)((ulong)((long)*(pointer *)
                                        ((long)&(this->super_SPxLPBase<double>).
                                                super_LPRowSetBase<double>.left.val.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                      left.val.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::vector<double,_std::allocator<double>_>::operator=
            (&this_01->val,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val);
  return;
}

Assistant:

void SPxSolverBase<R>::setPrimalBounds()
{

   theUCbound = SPxLPBase<R>::upper();
   theLCbound = SPxLPBase<R>::lower();

   if(rep() == ROW)
   {
      theURbound = this->rhs();
      theLRbound = this->lhs();
   }
   else
   {
      theURbound = this->lhs();
      theLRbound = this->rhs();
      theURbound *= -1.0;
      theLRbound *= -1.0;
   }
}